

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

void plutovg_color_init_rgba(plutovg_color_t *color,float r,float g,float b,float a)

{
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  plutovg_color_t *color_local;
  
  if (0.0 <= r) {
    local_28 = r;
    if (1.0 < r) {
      local_28 = 1.0;
    }
    local_24 = local_28;
  }
  else {
    local_24 = 0.0;
  }
  color->r = local_24;
  if (0.0 <= g) {
    local_30 = g;
    if (1.0 < g) {
      local_30 = 1.0;
    }
    local_2c = local_30;
  }
  else {
    local_2c = 0.0;
  }
  color->g = local_2c;
  if (0.0 <= b) {
    local_38 = b;
    if (1.0 < b) {
      local_38 = 1.0;
    }
    local_34 = local_38;
  }
  else {
    local_34 = 0.0;
  }
  color->b = local_34;
  if (0.0 <= a) {
    local_40 = a;
    if (1.0 < a) {
      local_40 = 1.0;
    }
    local_3c = local_40;
  }
  else {
    local_3c = 0.0;
  }
  color->a = local_3c;
  return;
}

Assistant:

void plutovg_color_init_rgba(plutovg_color_t* color, float r, float g, float b, float a)
{
    color->r = plutovg_clamp(r, 0.f, 1.f);
    color->g = plutovg_clamp(g, 0.f, 1.f);
    color->b = plutovg_clamp(b, 0.f, 1.f);
    color->a = plutovg_clamp(a, 0.f, 1.f);
}